

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

void __thiscall tinyxml2::XMLElement::SetText(XMLElement *this,char *inText)

{
  XMLDocument *pXVar1;
  int iVar2;
  undefined4 extraout_var;
  XMLNode *pXVar3;
  undefined4 extraout_var_00;
  
  pXVar3 = (this->super_XMLNode)._firstChild;
  if (pXVar3 != (XMLNode *)0x0) {
    iVar2 = (*pXVar3->_vptr_XMLNode[1])();
    if (CONCAT44(extraout_var,iVar2) != 0) {
      StrPair::SetStr(&((this->super_XMLNode)._firstChild)->_value,inText,0);
      return;
    }
  }
  pXVar1 = (this->super_XMLNode)._document;
  iVar2 = (*(pXVar1->_textPool).super_MemPool._vptr_MemPool[3])(&pXVar1->_textPool);
  pXVar3 = (XMLNode *)CONCAT44(extraout_var_00,iVar2);
  pXVar3->_document = pXVar1;
  pXVar3->_parent = (XMLNode *)0x0;
  (pXVar3->_value)._flags = 0;
  (pXVar3->_value)._start = (char *)0x0;
  (pXVar3->_value)._end = (char *)0x0;
  pXVar3->_parseLineNum = 0;
  pXVar3->_firstChild = (XMLNode *)0x0;
  pXVar3->_lastChild = (XMLNode *)0x0;
  pXVar3->_prev = (XMLNode *)0x0;
  pXVar3->_next = (XMLNode *)0x0;
  pXVar3->_userData = (void *)0x0;
  pXVar3->_vptr_XMLNode = (_func_int **)&PTR_ToElement_00115818;
  *(undefined1 *)&pXVar3[1]._vptr_XMLNode = 0;
  pXVar3->_memPool = &(pXVar1->_textPool).super_MemPool;
  StrPair::SetStr(&pXVar3->_value,inText,0);
  XMLNode::InsertFirstChild(&this->super_XMLNode,pXVar3);
  return;
}

Assistant:

void	XMLElement::SetText( const char* inText )
{
	if ( FirstChild() && FirstChild()->ToText() )
		FirstChild()->SetValue( inText );
	else {
		XMLText*	theText = GetDocument()->NewText( inText );
		InsertFirstChild( theText );
	}
}